

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

bool __thiscall xmrig::OclBackend::isEnabled(OclBackend *this)

{
  bool bVar1;
  Config *this_00;
  OclConfig *this_01;
  long in_RDI;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *unaff_retaddr;
  undefined1 local_9;
  
  this_00 = Base::config((Base *)**(undefined8 **)(in_RDI + 8));
  this_01 = Config::cl(this_00);
  bVar1 = OclConfig::isEnabled(this_01);
  local_9 = 0;
  if (bVar1) {
    bVar1 = OclLib::isInitialized();
    local_9 = 0;
    if (bVar1) {
      bVar1 = OclPlatform::isValid((OclPlatform *)(*(long *)(in_RDI + 8) + 0x30));
      local_9 = 0;
      if (bVar1) {
        bVar1 = std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::empty
                          (unaff_retaddr);
        local_9 = bVar1 ^ 0xff;
      }
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool xmrig::OclBackend::isEnabled() const
{
    return d_ptr->controller->config()->cl().isEnabled() && OclLib::isInitialized() && d_ptr->platform.isValid() && !d_ptr->devices.empty();
}